

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O2

void __thiscall
despot::ModeStatePolicy::ModeStatePolicy
          (ModeStatePolicy *this,DSPOMDP *model,StateIndexer *indexer,StatePolicy *policy,
          ParticleLowerBound *bound)

{
  int iVar1;
  
  DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  (this->super_DefaultPolicy).super_ScenarioLowerBound._vptr_ScenarioLowerBound =
       (_func_int **)&PTR__ModeStatePolicy_0019b3e0;
  this->indexer_ = indexer;
  this->policy_ = policy;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*indexer->_vptr_StateIndexer[2])(indexer);
  std::vector<double,_std::allocator<double>_>::resize(&this->state_probs_,(long)iVar1);
  return;
}

Assistant:

ModeStatePolicy::ModeStatePolicy(const DSPOMDP* model,
	const StateIndexer& indexer, const StatePolicy& policy,
	ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	indexer_(indexer),
	policy_(policy) {
	state_probs_.resize(indexer_.NumStates());
}